

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::lerp
          (LightNodeImpl<embree::SceneGraph::SpotLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  long *plVar1;
  void *pvVar2;
  LightNodeImpl<embree::SceneGraph::SpotLight> *this_00;
  long *in_RDX;
  long in_RSI;
  SpotLight *in_RDI;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>_> light1;
  SpotLight *in_stack_fffffffffffffed8;
  float f_00;
  SpotLight *pSVar3;
  long *local_70 [5];
  void *local_48;
  long **local_30;
  long **local_28;
  long **local_20;
  long *local_10;
  long **local_8;
  
  local_30 = local_70;
  pSVar3 = in_RDI;
  if (*in_RDX == 0) {
    plVar1 = (long *)0x0;
  }
  else {
    plVar1 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo,0);
  }
  local_8 = local_70;
  local_10 = plVar1;
  local_70[0] = plVar1;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  f_00 = (float)((ulong)plVar1 >> 0x20);
  pvVar2 = operator_new(0x3d5f27);
  this_00 = (LightNodeImpl<embree::SceneGraph::SpotLight> *)(in_RSI + 0x70);
  local_28 = local_70;
  SpotLight::lerp(pSVar3,in_RDI,f_00);
  LightNodeImpl(this_00,in_stack_fffffffffffffed8);
  *(void **)in_RDI = pvVar2;
  local_48 = pvVar2;
  if (*(long *)in_RDI != 0) {
    (**(code **)(**(long **)in_RDI + 0x10))();
  }
  local_20 = local_70;
  if (local_70[0] != (long *)0x0) {
    (**(code **)(*local_70[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::LightNode>)(LightNode *)pSVar3;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }